

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtVector3 *d,cbtScalar *w,U *m)

{
  uint uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  cbtVector3 *a_00;
  U i;
  long lVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var [60];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  cbtVector3 cVar25;
  cbtScalar local_d0;
  cbtScalar subw [3];
  cbtScalar cStack_b4;
  U subm;
  undefined1 auStack_94 [12];
  cbtVector3 *vt [4];
  cbtVector3 dl [3];
  
  auVar24 = in_ZMM1._8_56_;
  auVar15 = in_ZMM0._8_56_;
  vt[0] = a;
  vt[1] = b;
  vt[2] = c;
  vt[3] = d;
  cVar25 = ::operator-(a,d);
  auVar16._0_8_ = cVar25.m_floats._8_8_;
  auVar16._8_56_ = auVar24;
  auVar22._0_8_ = cVar25.m_floats._0_8_;
  auVar22._8_56_ = auVar15;
  dl[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar16._0_16_);
  auVar15 = ZEXT856(dl[0].m_floats._8_8_);
  cVar25 = ::operator-(b,d);
  auVar17._0_8_ = cVar25.m_floats._8_8_;
  auVar17._8_56_ = auVar24;
  auVar8._0_8_ = cVar25.m_floats._0_8_;
  auVar8._8_56_ = auVar15;
  dl[1].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar17._0_16_);
  auVar15 = ZEXT856(dl[1].m_floats._8_8_);
  cVar25 = ::operator-(c,d);
  auVar18._0_8_ = cVar25.m_floats._8_8_;
  auVar18._8_56_ = auVar24;
  auVar9._0_8_ = cVar25.m_floats._0_8_;
  auVar9._8_56_ = auVar15;
  dl[2].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar18._0_16_);
  a_00 = dl;
  cVar6 = det(a_00,dl + 1,dl + 2);
  auVar15 = extraout_var_00;
  cVar25 = ::operator-(b,c);
  auVar19._0_8_ = cVar25.m_floats._8_8_;
  auVar19._8_56_ = auVar24;
  auVar10._0_8_ = cVar25.m_floats._0_8_;
  auVar10._8_56_ = auVar15;
  _subw = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar19._0_16_);
  auVar15 = ZEXT856(subw._8_8_);
  cVar25 = ::operator-(a,b);
  auVar20._0_8_ = cVar25.m_floats._8_8_;
  auVar20._8_56_ = auVar24;
  auVar11._0_8_ = cVar25.m_floats._0_8_;
  auVar11._8_56_ = auVar15;
  _subm = (cbtScalar  [4])vmovlhps_avx(auVar11._0_16_,auVar20._0_16_);
  auVar15 = ZEXT856(subm._8_8_);
  cVar25 = cbtVector3::cross((cbtVector3 *)subw,(cbtVector3 *)&subm);
  auVar21._0_8_ = cVar25.m_floats._8_8_;
  auVar21._8_56_ = auVar24;
  auVar12._0_8_ = cVar25.m_floats._0_8_;
  auVar12._8_56_ = auVar15;
  local_d0 = -1.0;
  if (cVar6 != 0.0) {
    auVar2 = vmovshdup_avx(auVar12._0_16_);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * a->m_floats[1])),auVar12._0_16_,
                             ZEXT416((uint)a->m_floats[0]));
    auVar2 = vfmadd132ss_fma(auVar21._0_16_,auVar2,ZEXT416((uint)a->m_floats[2]));
    auVar22 = ZEXT1664(auVar2);
    if (cVar6 * auVar2._0_4_ <= 0.0) {
      auVar13 = ZEXT464(0xbf800000);
      lVar5 = 0;
      subw[2] = 0.0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = stack0xffffffffffffff48;
      _subw = (cbtScalar  [4])(auVar2 << 0x40);
      auVar4._12_4_ = 0;
      auVar4._0_12_ = auStack_94;
      _subm = (cbtScalar  [4])(auVar4 << 0x20);
      local_d0 = -1.0;
      while( true ) {
        auVar24 = auVar22._8_56_;
        auVar15 = auVar13._8_56_;
        if (lVar5 == 3) break;
        uVar1 = projectorigin::imd3[lVar5];
        cVar25 = cbtVector3::cross(a_00,dl + uVar1);
        auVar23._0_8_ = cVar25.m_floats._8_8_;
        auVar23._8_56_ = auVar24;
        auVar14._0_8_ = cVar25.m_floats._0_8_;
        auVar14._8_56_ = auVar15;
        auVar2 = vmovshdup_avx(auVar14._0_16_);
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * d->m_floats[1])),auVar14._0_16_,
                                 ZEXT416((uint)d->m_floats[0]));
        auVar2 = vfmadd132ss_fma(auVar23._0_16_,auVar2,ZEXT416((uint)d->m_floats[2]));
        auVar22 = ZEXT1664(auVar2);
        fVar3 = auVar2._0_4_ * cVar6;
        auVar13 = ZEXT464((uint)fVar3);
        if (0.0 < fVar3) {
          auVar13._0_4_ = projectorigin(vt[lVar5],vt[uVar1],d,subw,&subm);
          auVar13._4_60_ = extraout_var;
          if ((local_d0 < 0.0) || (auVar22 = ZEXT464((uint)local_d0), auVar13._0_4_ < local_d0)) {
            *m = (1 << (uVar1 & 0x1f) & (int)(subm << 0x1e) >> 0x1f) + (subm & 4) * 2 +
                 (1 << ((uint)lVar5 & 0x1f) & -(subm & 1));
            w[lVar5] = subw[0];
            w[uVar1] = subw[1];
            w[projectorigin::imd3[uVar1]] = 0.0;
            auVar22 = ZEXT464((uint)subw[2]);
            w[3] = subw[2];
            local_d0 = auVar13._0_4_;
          }
        }
        lVar5 = lVar5 + 1;
        a_00 = a_00 + 1;
      }
      if (local_d0 < 0.0) {
        *m = 0xf;
        cVar7 = det(c,b,d);
        *w = cVar7 / cVar6;
        cVar7 = det(a,c,d);
        w[1] = cVar7 / cVar6;
        cVar7 = det(b,a,d);
        w[2] = cVar7 / cVar6;
        w[3] = 1.0 - (cVar7 / cVar6 + *w + w[1]);
        local_d0 = 0.0;
      }
    }
  }
  return local_d0;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  const cbtVector3& d,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c, &d};
		const cbtVector3 dl[] = {a - d, b - d, c - d};
		const cbtScalar vl = det(dl[0], dl[1], dl[2]);
		const bool ng = (vl * cbtDot(a, cbtCross(b - c, a - b))) <= 0;
		if (ng && (cbtFabs(vl) > GJK_SIMPLEX4_EPS))
		{
			cbtScalar mindist = -1;
			cbtScalar subw[3] = {0.f, 0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				const U j = imd3[i];
				const cbtScalar s = vl * cbtDot(d, cbtCross(dl[i], dl[j]));
				if (s > 0)
				{
					const cbtScalar subd = projectorigin(*vt[i], *vt[j], d, subw, subm);
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>((subm & 1 ? 1 << i : 0) +
										   (subm & 2 ? 1 << j : 0) +
										   (subm & 4 ? 8 : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
						w[3] = subw[2];
					}
				}
			}
			if (mindist < 0)
			{
				mindist = 0;
				m = 15;
				w[0] = det(c, b, d) / vl;
				w[1] = det(a, c, d) / vl;
				w[2] = det(b, a, d) / vl;
				w[3] = 1 - (w[0] + w[1] + w[2]);
			}
			return (mindist);
		}
		return (-1);
	}